

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O2

void __thiscall HighsMipSolverData::checkObjIntegrality(HighsMipSolverData *this)

{
  double dVar1;
  
  HighsObjectiveFunction::checkIntegrality(&this->objectiveFunction,this->epsilon);
  dVar1 = (this->objectiveFunction).objIntScale;
  if (((dVar1 != 0.0) || (NAN(dVar1))) && (this->numRestarts == 0)) {
    highsLogUser(&(this->mipsolver->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
                 "Objective function is integral with scale %g\n");
    return;
  }
  return;
}

Assistant:

void HighsMipSolverData::checkObjIntegrality() {
  objectiveFunction.checkIntegrality(epsilon);
  if (objectiveFunction.isIntegral() && numRestarts == 0) {
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 "Objective function is integral with scale %g\n",
                 objectiveFunction.integralScale());
  }
}